

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vs_wrapper.hpp
# Opt level: O2

void __thiscall
VSInterface::VSInDelegator::Read
          (VSInDelegator *this,char *name,vector<float,_std::allocator<float>_> *output)

{
  int iVar1;
  undefined8 in_RAX;
  int i;
  int iVar2;
  double dVar3;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  iVar1 = (*this->_vsapi->propNumElements)(this->_in,name);
  if (-1 < iVar1) {
    if (*(long *)(output + 8) != *(long *)output) {
      *(long *)(output + 8) = *(long *)output;
    }
    for (iVar2 = 0; iVar1 != iVar2; iVar2 = iVar2 + 1) {
      dVar3 = (*this->_vsapi->propGetFloat)(this->_in,name,iVar2,&this->_err);
      uStack_38 = CONCAT44((float)dVar3,(undefined4)uStack_38);
      std::vector<float,_std::allocator<float>_>::emplace_back<float>
                (output,(float *)((long)&uStack_38 + 4));
    }
  }
  return;
}

Assistant:

void Read(const char* name, std::vector<float>& output) override {
      auto size = _vsapi->propNumElements(_in, name);
      if (size < 0) return;
      output.clear();
      for (int i = 0; i < size; i++)
        output.push_back(static_cast<float>(_vsapi->propGetFloat(_in, name, i, &_err)));
    }